

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::clean_name_string(string *name,string *keyChars)

{
  char *pcVar1;
  char __c;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  string sStack_38;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(name,keyChars,0);
  if ((sVar3 == 0xffffffffffffffff) &&
     (((pcVar1 = (name->_M_dataplus)._M_p, *pcVar1 != '[' ||
       (pcVar1[name->_M_string_length - 1] != ']')) &&
      (sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             name,"\'`\"\\",0), sVar4 == 0xffffffffffffffff)))) {
    return name;
  }
  sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,'\'',
                     0);
  if (sVar4 == 0xffffffffffffffff) {
    __c = '\'';
  }
  else {
    bVar2 = detail::has_escapable_character(name);
    if (bVar2) {
      detail::add_escaped_characters(&sStack_38,name);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_38);
      ::std::__cxx11::string::~string((string *)&sStack_38);
    }
    __c = '\"';
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (name,0,1,__c);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,__c);
  return name;
}

Assistant:

CLI11_INLINE std::string &clean_name_string(std::string &name, const std::string &keyChars) {
    if(name.find_first_of(keyChars) != std::string::npos || (name.front() == '[' && name.back() == ']') ||
       (name.find_first_of("'`\"\\") != std::string::npos)) {
        if(name.find_first_of('\'') == std::string::npos) {
            name.insert(0, 1, '\'');
            name.push_back('\'');
        } else {
            if(detail::has_escapable_character(name)) {
                name = detail::add_escaped_characters(name);
            }
            name.insert(0, 1, '\"');
            name.push_back('\"');
        }
    }
    return name;
}